

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_json_number_long_zero(void)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  _Bool r;
  bson_t b;
  char *json;
  bson_iter_t iter;
  bson_error_t error;
  undefined1 local_400 [248];
  char *local_308;
  undefined1 local_300 [112];
  undefined1 local_290 [8];
  undefined1 auStack_288 [640];
  
  local_308 = "{ \"key\": { \"$numberLong\": \"0\" }}";
  bVar1 = bson_init_from_json(local_400,"{ \"key\": { \"$numberLong\": \"0\" }}",0xffffffffffffffff,
                              local_290);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s\n",auStack_288);
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x60f,"test_bson_json_number_long_zero","r");
    abort();
  }
  bVar1 = bson_iter_init(local_300,local_400);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x610,"test_bson_json_number_long_zero","bson_iter_init (&iter, &b)");
    abort();
  }
  bVar1 = bson_iter_find(local_300,"key");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x611,"test_bson_json_number_long_zero","bson_iter_find (&iter, \"key\")");
    abort();
  }
  iVar2 = bson_iter_type(local_300);
  if (iVar2 == 0x12) {
    lVar3 = bson_iter_int64(local_300);
    if (lVar3 == 0) {
      bson_destroy(local_400);
      return;
    }
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x613,"test_bson_json_number_long_zero","bson_iter_int64 (&iter) == 0");
    abort();
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x612,"test_bson_json_number_long_zero","BSON_ITER_HOLDS_INT64 (&iter)");
  abort();
}

Assistant:

static void
test_bson_json_number_long_zero (void)
{
   bson_error_t error;
   bson_iter_t iter;
   const char *json = "{ \"key\": { \"$numberLong\": \"0\" }}";
   bson_t b;
   bool r;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);
   BSON_ASSERT (bson_iter_init (&iter, &b));
   BSON_ASSERT (bson_iter_find (&iter, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   BSON_ASSERT (bson_iter_int64 (&iter) == 0);
   bson_destroy (&b);
}